

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::ParsedIR::ParsedIR(ParsedIR *this)

{
  _Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false> _Var1;
  __uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  _Var2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pSVar3;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar4;
  pointer __p;
  unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  uVar5;
  long lVar6;
  
  (this->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size = 0;
  (this->pool_group)._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl =
       (ObjectPoolGroup *)0x0;
  (this->spirv).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spirv).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spirv).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr =
       (Variant *)&(this->ids).stack_storage;
  (this->ids).buffer_capacity = 8;
  (this->meta)._M_h._M_buckets = &(this->meta)._M_h._M_single_bucket;
  (this->meta)._M_h._M_bucket_count = 1;
  (this->meta)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->meta)._M_h._M_element_count = 0;
  (this->meta)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->meta)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->meta)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pSVar3 = this->ids_for_type;
  lVar6 = 0x310;
  do {
    pAVar4 = &pSVar3->stack_storage;
    *(undefined8 *)((long)(pAVar4 + -1) + 0x10) = 0;
    *(AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> **)
     ((long)(pAVar4 + -1) + 8) = pAVar4;
    *(undefined8 *)((long)(pAVar4 + -1) + 0x18) = 8;
    pSVar3 = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
             (pAVar4 + 1);
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != 0);
  (this->ids_for_constant_undef_or_type).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size = 0;
  (this->ids_for_constant_undef_or_type).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)0> *)
       &(this->ids_for_constant_undef_or_type).stack_storage;
  (this->ids_for_constant_undef_or_type).buffer_capacity = 8;
  (this->ids_for_constant_or_variable).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size = 0;
  (this->ids_for_constant_or_variable).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)0> *)
       &(this->ids_for_constant_or_variable).stack_storage;
  (this->ids_for_constant_or_variable).buffer_capacity = 8;
  (this->load_type_width)._M_h._M_buckets = &(this->load_type_width)._M_h._M_single_bucket;
  (this->load_type_width)._M_h._M_bucket_count = 1;
  (this->load_type_width)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->load_type_width)._M_h._M_element_count = 0;
  (this->load_type_width)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->load_type_width)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->load_type_width)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->declared_capabilities).super_VectorView<spv::Capability>.buffer_size = 0;
  (this->declared_capabilities).super_VectorView<spv::Capability>.ptr =
       (Capability *)&(this->declared_capabilities).stack_storage;
  (this->declared_capabilities).buffer_capacity = 8;
  (this->declared_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  (this->declared_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(this->declared_extensions).stack_storage;
  (this->declared_extensions).buffer_capacity = 8;
  (this->block_meta).super_VectorView<unsigned_char>.buffer_size = 0;
  (this->block_meta).super_VectorView<unsigned_char>.ptr =
       (uchar *)&(this->block_meta).stack_storage;
  (this->block_meta).buffer_capacity = 8;
  (this->continue_block_to_loop_header)._M_h._M_buckets =
       &(this->continue_block_to_loop_header)._M_h._M_single_bucket;
  (this->continue_block_to_loop_header)._M_h._M_bucket_count = 1;
  (this->continue_block_to_loop_header)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->continue_block_to_loop_header)._M_h._M_element_count = 0;
  (this->continue_block_to_loop_header)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->continue_block_to_loop_header)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->continue_block_to_loop_header)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->entry_points)._M_h._M_buckets = &(this->entry_points)._M_h._M_single_bucket;
  (this->entry_points)._M_h._M_bucket_count = 1;
  (this->entry_points)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->entry_points)._M_h._M_element_count = 0;
  (this->entry_points)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->entry_points)._M_h._M_single_bucket + 3) = 0;
  *(undefined8 *)((long)&(this->default_entry_point).id + 3) = 0;
  (this->entry_points)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->entry_points)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->addressing_model = AddressingModelMax;
  this->memory_model = Max;
  this->loop_iteration_depth_hard = 0;
  this->loop_iteration_depth_soft = 0;
  (this->empty_string)._M_dataplus._M_p = (pointer)&(this->empty_string).field_2;
  (this->empty_string)._M_string_length = 0;
  (this->empty_string).field_2._M_local_buf[0] = '\0';
  (this->cleared_bitset).lower = 0;
  (this->cleared_bitset).higher._M_h._M_buckets =
       &(this->cleared_bitset).higher._M_h._M_single_bucket;
  (this->cleared_bitset).higher._M_h._M_bucket_count = 1;
  (this->cleared_bitset).higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cleared_bitset).higher._M_h._M_element_count = 0;
  (this->cleared_bitset).higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cleared_bitset).higher._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cleared_bitset).higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->meta_needing_name_fixup)._M_h._M_buckets =
       &(this->meta_needing_name_fixup)._M_h._M_single_bucket;
  (this->meta_needing_name_fixup)._M_h._M_bucket_count = 1;
  (this->meta_needing_name_fixup)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->meta_needing_name_fixup)._M_h._M_element_count = 0;
  (this->meta_needing_name_fixup)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->meta_needing_name_fixup)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->meta_needing_name_fixup)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __p = (pointer)::operator_new(0x70);
  __p->pools[0xc]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[0xd]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[10]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[0xb]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[8]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[9]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[6]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[7]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[4]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[5]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[2]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[3]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[0]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  __p->pools[1]._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (ObjectPoolBase *)0x0;
  ::std::
  __uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
  ::reset((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
           *)this,__p);
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3680;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 8))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 8))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac36d0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x10))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x10))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3710;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x18))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x18))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3750;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x20))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x20))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3790;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x28))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x28))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac37d0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x30))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x30))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3810;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x38))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x38))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3850;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x40))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x40))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3890;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x48))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x48))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac38d0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x50))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x50))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3910;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x58))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x58))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3950;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x60))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x60))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
  }
  _Var1._M_head_impl =
       (this->pool_group)._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
  uVar5._M_t.
  super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>,_true,_true>
        )::operator_new(0x88);
  *(undefined ***)
   uVar5._M_t.
   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   ._M_t.
   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       &PTR__ObjectPool_00ac3990;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x18)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 8) =
       0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x30)
       = 0;
  *(undefined8 **)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x28)
       = (undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl +
         0x40);
  *(undefined8 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x38)
       = 8;
  *(undefined4 *)
   ((long)uVar5._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl + 0x80)
       = 0x10;
  _Var2._M_t.
  super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
  .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
       *(tuple<diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
         *)&((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
              *)((long)(_Var1._M_head_impl)->pools + 0x68))->_M_t;
  ((unique_ptr<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
    *)((long)(_Var1._M_head_impl)->pools + 0x68))->_M_t =
       uVar5._M_t.
       super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
        .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                          _M_head_impl + 8))();
    return;
  }
  return;
}

Assistant:

ParsedIR::ParsedIR()
{
	// If we move ParsedIR, we need to make sure the pointer stays fixed since the child Variant objects consume a pointer to this group,
	// so need an extra pointer here.
	pool_group.reset(new ObjectPoolGroup);

	pool_group->pools[TypeType].reset(new ObjectPool<SPIRType>);
	pool_group->pools[TypeVariable].reset(new ObjectPool<SPIRVariable>);
	pool_group->pools[TypeConstant].reset(new ObjectPool<SPIRConstant>);
	pool_group->pools[TypeFunction].reset(new ObjectPool<SPIRFunction>);
	pool_group->pools[TypeFunctionPrototype].reset(new ObjectPool<SPIRFunctionPrototype>);
	pool_group->pools[TypeBlock].reset(new ObjectPool<SPIRBlock>);
	pool_group->pools[TypeExtension].reset(new ObjectPool<SPIRExtension>);
	pool_group->pools[TypeExpression].reset(new ObjectPool<SPIRExpression>);
	pool_group->pools[TypeConstantOp].reset(new ObjectPool<SPIRConstantOp>);
	pool_group->pools[TypeCombinedImageSampler].reset(new ObjectPool<SPIRCombinedImageSampler>);
	pool_group->pools[TypeAccessChain].reset(new ObjectPool<SPIRAccessChain>);
	pool_group->pools[TypeUndef].reset(new ObjectPool<SPIRUndef>);
	pool_group->pools[TypeString].reset(new ObjectPool<SPIRString>);
}